

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O1

int textinput(void)

{
  ostream *poVar1;
  int iVar2;
  char ch;
  char local_2a;
  char local_29;
  
  std::operator>>((istream *)&std::cin,&local_2a);
  std::istream::get((char *)&std::cin);
  iVar2 = 0;
  if (((byte)cos[*(long *)(std::cin + -0x18)] & 5) == 0) {
    iVar2 = 0;
    do {
      local_29 = local_2a;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      iVar2 = iVar2 + 1;
      std::istream::get((char *)&std::cin);
    } while (((byte)cos[*(long *)(std::cin + -0x18)] & 5) == 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," charactors readed.",0x13);
  return 0;
}

Assistant:

int textinput () {
    using namespace std;

    char ch;
    int count = 0;

//    cout << "Enter something, enter # to stop:\n";
//    cout << "Enter something:\n";
    cin >> ch;
    //  cin.get() 可以获取空格、换行
    cin.get(ch);

    //  检测EOF： cin.fail() == true
    while (cin.fail() == false) {
        cout << ch;
        ++count;
//        cin >> ch;
        cin.get(ch);
    }

    cout << "\n" << count << " charactors readed.";

    return 0;
}